

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

string * __thiscall
testing::internal::PrintTestPartResultToString_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,TestPartResult *test_part_result)

{
  ostream *poVar1;
  size_t sVar2;
  string *extraout_RAX;
  string *psVar3;
  int in_ECX;
  internal *this_00;
  char *pcVar4;
  Message local_50;
  string local_48;
  
  Message::Message(&local_50);
  this_00 = *(internal **)(this + 0x10);
  if (this_00 != (internal *)0x0) {
    this_00 = *(internal **)(this + 8);
  }
  FormatFileLocation_abi_cxx11_(&local_48,this_00,(char *)(ulong)*(uint *)(this + 0x28),in_ECX);
  poVar1 = (ostream *)((long)local_50.ss_.ptr_ + 0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,local_48._M_dataplus._M_p,local_48._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  if ((ulong)*(uint *)this < 3) {
    pcVar4 = &DAT_001333f0 + *(int *)(&DAT_001333f0 + (ulong)*(uint *)this * 4);
  }
  else {
    pcVar4 = "Unknown result type";
  }
  sVar2 = strlen(pcVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar4,sVar2);
  pcVar4 = *(char **)(this + 0x50);
  if (pcVar4 == (char *)0x0) {
    sVar2 = 6;
    pcVar4 = "(null)";
  }
  else {
    sVar2 = strlen(pcVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar4,sVar2);
  StringStreamToString(__return_storage_ptr__,(stringstream *)local_50.ss_.ptr_);
  psVar3 = (string *)&local_48.field_2;
  if ((string *)local_48._M_dataplus._M_p != psVar3) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    psVar3 = extraout_RAX;
  }
  if (local_50.ss_.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    psVar3 = (string *)(**(code **)(*(long *)local_50.ss_.ptr_ + 8))(local_50.ss_.ptr_);
  }
  return psVar3;
}

Assistant:

static std::string PrintTestPartResultToString(
    const TestPartResult& test_part_result) {
  return (Message()
          << internal::FormatFileLocation(test_part_result.file_name(),
                                          test_part_result.line_number())
          << " " << TestPartResultTypeToString(test_part_result.type())
          << test_part_result.message()).GetString();
}